

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

double __thiscall TPZMatrix<double>::GetRandomVal(TPZMatrix<double> *this)

{
  result_type_conflict1 rVar1;
  int iVar2;
  
  if (GetRandomVal()::unif == '\0') {
    iVar2 = __cxa_guard_acquire(&GetRandomVal()::unif);
    if (iVar2 != 0) {
      GetRandomVal::unif._M_param._M_a._0_4_ = 0;
      GetRandomVal::unif._M_param._M_a._4_4_ = 0;
      GetRandomVal::unif._M_param._M_b._0_4_ = 0;
      GetRandomVal::unif._M_param._M_b._4_4_ = 0x3ff00000;
      __cxa_guard_release(&GetRandomVal()::unif);
    }
  }
  if (GetRandomVal()::re == '\0') {
    iVar2 = __cxa_guard_acquire(&GetRandomVal()::re);
    if (iVar2 != 0) {
      GetRandomVal::re._M_x = 1;
      __cxa_guard_release(&GetRandomVal()::re);
    }
  }
  rVar1 = std::uniform_real_distribution<double>::operator()(&GetRandomVal::unif,&GetRandomVal::re);
  return rVar1;
}

Assistant:

TVar TPZMatrix<TVar>::GetRandomVal() const{

    if constexpr (std::is_integral_v<TVar> ||
                  std::is_same_v<TVar,TPZFlopCounter>){
        return  ((TVar) rand())/((TVar)RAND_MAX);
    }
    
    else if constexpr (is_fad<TVar>::value){
      constexpr typename TVar::value_type lower_bound = 0;
      constexpr typename TVar::value_type upper_bound = 1;
      static std::uniform_real_distribution<typename TVar::value_type>
        unif(lower_bound,upper_bound);
      static std::default_random_engine re;
      TVar a_random = (TVar)unif(re);
      if constexpr (is_complex<TVar>::value){
        a_random+= (TVar)1i * (TVar)unif(re);
      }
      return a_random;
    }else{
        constexpr RTVar lower_bound = 0;
        constexpr RTVar upper_bound = 1;
        static std::uniform_real_distribution<RTVar> unif(lower_bound,upper_bound);
        static std::default_random_engine re;
        TVar a_random = (TVar)unif(re);
        if constexpr (is_complex<TVar>::value){
            a_random+= (TVar)1i * (TVar)unif(re);
        }
        return a_random;
    }
}